

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O3

void __thiscall
TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>_>::SetIntegrationRule
          (TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>_> *this,int ord)

{
  int iVar1;
  TPZIntPoints *pTVar2;
  
  TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>::SetIntegrationRule
            (&this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>,ord);
  pTVar2 = TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>::GetIntegrationRule
                     (&this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>);
  iVar1 = (*pTVar2->_vptr_TPZIntPoints[3])(pTVar2);
  if ((this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fNElements ==
      (long)iVar1) {
    return;
  }
  (**(code **)(*(long *)&(this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>).
                         super_TPZMultiphysicsElement.super_TPZCompEl + 0x178))(this);
  (**(code **)(*(long *)&(this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoPoint>).
                         super_TPZMultiphysicsElement.super_TPZCompEl + 0x168))(this);
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::SetIntegrationRule(int ord)
{
    TBASE::SetIntegrationRule(ord);
    // verify if the number of integration points changed
    const TPZIntPoints &intrule = TBASE::GetIntegrationRule();
    int intrulepoints = intrule.NPoints();
    if (intrulepoints != fIntPtIndices.size()) {
        SetFreeIntPtIndices();
        PrepareIntPtIndices();
    }
    
}